

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_color_pick(nk_context *ctx,nk_colorf *color,nk_color_format fmt)

{
  nk_vec2 nVar1;
  undefined4 uVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_user_font *pnVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  nk_colorf *pnVar8;
  nk_widget_layout_states nVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  nk_color top;
  long lVar14;
  nk_command_buffer *b;
  nk_context *i;
  nk_flags nVar15;
  nk_flags *state;
  float fVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_colorf nVar25;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  nk_rect rect_05;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  float fStack_e4;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  nk_rect bounds;
  float fStack_44;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee1,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  if (color == (nk_colorf *)0x0) {
    __assert_fail("color",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee2,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee3,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  pnVar4 = pnVar3->layout;
  if (pnVar4 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5ee4,
                  "int nk_color_pick(struct nk_context *, struct nk_colorf *, enum nk_color_format)"
                 );
  }
  nVar9 = nk_widget(&bounds,ctx);
  if (nVar9 == NK_WIDGET_INVALID) {
    return 0;
  }
  i = (nk_context *)0x0;
  if ((nVar9 != NK_WIDGET_ROM) && ((pnVar4->flags & 0x1000) == 0)) {
    i = ctx;
  }
  pnVar5 = (ctx->style).font;
  if (pnVar5 == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5eb7,
                  "int nk_do_color_picker(nk_flags *, struct nk_command_buffer *, struct nk_colorf *, enum nk_color_format, struct nk_rect, struct nk_vec2, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  state = &ctx->last_widget_state;
  fVar22 = bounds.h;
  fVar19 = pnVar5->height;
  local_a8 = ZEXT416((uint)fVar19);
  fVar23 = bounds.x + 0.0;
  fVar24 = bounds.y + 0.0;
  fVar16 = fVar19 + fVar19 + 0.0;
  local_68._0_4_ = bounds.w - fVar16;
  register0x00001244 = (ulong)bounds._8_8_ >> 0x20;
  fStack_5c = 0.0;
  local_98 = CONCAT44(fVar22,bounds.w - fVar16);
  uStack_90 = 0;
  local_e8 = bounds.w;
  fStack_e4 = bounds.h;
  uStack_e0 = 0;
  local_c8._4_4_ = fVar22;
  local_c8._0_4_ = fVar19;
  local_c8._8_8_ = 0;
  rect_05.y = fVar24;
  rect_05.x = fVar23;
  local_f8 = CONCAT44(fVar24,fVar23 + (float)local_68._0_4_);
  uStack_f0 = 0;
  local_d8 = CONCAT44(fVar24,fVar23 + (float)local_68._0_4_);
  uStack_d0 = 0;
  local_88 = color;
  nk_colorf_hsva_fv(&local_108,*color);
  iVar13 = 1;
  r.w = (float)(undefined4)local_98;
  r.h = (float)local_98._4_4_;
  r.x = fVar23;
  r.y = fVar24;
  iVar10 = nk_button_behavior(state,r,&i->input,NK_BUTTON_REPEATER);
  auVar7 = local_c8;
  if (iVar10 == 0) {
    iVar13 = 0;
  }
  else {
    auVar20._0_4_ = (float)local_68._0_4_ + -1.0;
    auVar20._4_4_ = fStack_e4 + -1.0;
    auVar20._8_4_ = (float)uStack_e0 + 0.0;
    auVar20._12_4_ = uStack_e0._4_4_ + 0.0;
    nVar1 = (i->input).mouse.pos;
    auVar18._0_4_ = nVar1.x - fVar23;
    auVar18._4_4_ = nVar1.y - fVar24;
    auVar18._8_8_ = 0;
    auVar18 = divps(auVar18,auVar20);
    fVar19 = auVar18._4_4_;
    auVar21._4_4_ = -(uint)(0.0 < auVar18._0_4_);
    auVar21._0_4_ = -(uint)(0.0 < fVar19);
    auVar21._8_4_ = -(uint)(1.0 < fVar19);
    auVar21._12_4_ = -(uint)(1.0 < auVar18._0_4_);
    uVar11 = movmskps(iVar10,auVar21);
    local_104 = 1.0;
    fVar16 = local_104;
    if ((uVar11 & 1) == 0) {
      fVar16 = 0.0;
    }
    local_100 = 1.0;
    if ((uVar11 & 4) == 0) {
      local_100 = fVar16;
    }
    if ((uVar11 & 1) == 0) {
      fVar19 = local_100;
    }
    if ((uVar11 & 4) == 0) {
      local_100 = fVar19;
    }
    if ((uVar11 & 10) == 0) {
      local_104 = 0.0;
    }
    if ((uVar11 & 2) == 0) {
      auVar18 = ZEXT416((uint)local_104);
    }
    if ((uVar11 & 8) == 0) {
      local_104 = auVar18._0_4_;
    }
    local_100 = 1.0 - local_100;
  }
  local_b8 = (float)local_a8._0_4_ + (float)local_f8;
  uStack_b4 = local_a8._4_4_;
  uStack_b0 = local_a8._8_4_;
  uStack_ac = local_a8._12_4_;
  r_00.w = (float)local_c8._0_4_;
  r_00.h = (float)local_c8._4_4_;
  r_00.x = (float)local_d8;
  r_00.y = (float)local_d8._4_4_;
  local_c8 = auVar7;
  iVar10 = nk_button_behavior(state,r_00,&i->input,NK_BUTTON_REPEATER);
  auVar7 = local_c8;
  if (iVar10 != 0) {
    fVar16 = ((i->input).mouse.pos.y - fVar24) / (fVar22 + -1.0);
    local_108 = (float)(-(uint)(1.0 < fVar16) & 0x3f800000 |
                       ~-(uint)(1.0 < fVar16) & -(uint)(0.0 < fVar16) & 0x3f800000);
    fVar19 = fVar16;
    if (fVar16 <= 0.0) {
      fVar19 = local_108;
    }
    iVar13 = 1;
    if (fVar16 <= 1.0) {
      local_108 = fVar19;
    }
  }
  local_d8 = CONCAT44(fVar24,fVar24);
  uStack_d0 = CONCAT44(fVar24,fVar24);
  local_78 = local_b8;
  uStack_70 = 0;
  uStack_6c = 0;
  iVar10 = iVar13;
  fStack_74 = fVar24;
  if (fmt == NK_RGBA) {
    r_01.y = fVar24;
    r_01.x = local_b8;
    r_01.w = (float)local_c8._0_4_;
    r_01.h = (float)local_c8._4_4_;
    local_c8 = auVar7;
    iVar12 = nk_button_behavior(state,r_01,&i->input,NK_BUTTON_REPEATER);
    if (iVar12 != 0) {
      fVar16 = ((i->input).mouse.pos.y - (float)local_d8) / (fVar22 + -1.0);
      local_fc = (float)(-(uint)(1.0 < fVar16) & 0x3f800000 |
                        ~-(uint)(1.0 < fVar16) & -(uint)(0.0 < fVar16) & 0x3f800000);
      fVar19 = fVar16;
      if (fVar16 <= 0.0) {
        fVar19 = local_fc;
      }
      if (fVar16 <= 1.0) {
        local_fc = fVar19;
      }
      local_fc = 1.0 - local_fc;
      iVar10 = 1;
    }
  }
  pnVar8 = local_88;
  uVar11 = *state & 2 | 4;
  *state = uVar11;
  if (iVar13 != 0) {
    uVar11 = 0x22;
    nVar25 = nk_hsva_colorfv(&local_108);
    *pnVar8 = nVar25;
    *state = 0x22;
  }
  if (iVar10 != 0) {
    pnVar8->a = local_fc;
    *state = 0x22;
    uVar11 = 0x22;
  }
  rect.y = fVar24;
  rect.x = fVar23;
  rect.w = local_e8;
  rect.h = fStack_e4;
  iVar13 = nk_input_is_mouse_hovering_rect(&i->input,rect);
  if (iVar13 == 0) {
LAB_0013a7e7:
    rect_01.w = local_e8;
    rect_01.h = fStack_e4;
    rect_01.x = fVar23;
    rect_01.y = fVar24;
    iVar13 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_01);
    if (iVar13 == 0) goto LAB_0013a80a;
    nVar15 = uVar11 | 0x40;
  }
  else {
    *state = 0x12;
    uVar11 = 0x12;
    rect_00.w = local_e8;
    rect_00.h = fStack_e4;
    rect_00.x = fVar23;
    rect_00.y = fVar24;
    iVar13 = nk_input_is_mouse_prev_hovering_rect(&i->input,rect_00);
    if (iVar13 != 0) goto LAB_0013a7e7;
    nVar15 = 0x1a;
  }
  *state = nVar15;
LAB_0013a80a:
  b = &pnVar3->buffer;
  uVar2 = pnVar8->a;
  nk_colorf_hsva_fv(&local_108,*pnVar8);
  local_88 = (nk_colorf *)CONCAT44(fVar22 / 6.0 + 0.5,local_a8._0_4_);
  uStack_80 = local_a8._8_4_;
  uStack_7c = local_a8._12_4_;
  lVar14 = 0;
  local_e8 = fVar22 / 6.0;
  while( true ) {
    if (lVar14 == 6) break;
    rect_02.y = (float)(int)lVar14 * local_e8 + (float)local_d8 + 0.5;
    rect_02.x = (float)local_f8;
    rect_02.w = (float)(undefined4)local_88;
    rect_02.h = (float)local_88._4_4_;
    nk_fill_rect_multi_color
              (b,rect_02,*(nk_color *)(&nk_draw_color_picker_hue_colors + lVar14),
               *(nk_color *)(&nk_draw_color_picker_hue_colors + lVar14),
               *(nk_color *)(&DAT_0015a8c4 + lVar14),*(nk_color *)(&DAT_0015a8c4 + lVar14));
    lVar14 = lVar14 + 1;
  }
  _local_e8 = CONCAT44(fStack_e4,local_108);
  fVar19 = (float)(int)(local_108 * fVar22 + (float)local_d8 + 0.5);
  nk_stroke_line(b,(float)local_f8 + -1.0,fVar19,local_b8 + 2.0,fVar19,1.0,(nk_color)0xffffffff);
  auVar7 = local_c8;
  if (fmt == NK_RGBA) {
    auVar17 = ZEXT812(0x3f800000);
    if ((float)uVar2 <= 1.0) {
      auVar17._4_8_ = 0;
      auVar17._0_4_ = uVar2;
    }
    if (auVar17._0_4_ <= 0.0) {
      auVar6._8_4_ = 0;
      auVar6._0_8_ = auVar17._4_8_;
      auVar17 = auVar6 << 0x20;
    }
    local_f8 = (ulong)(uint)(float)(int)((1.0 - auVar17._0_4_) * fVar22 + (float)local_d8 + 0.5);
    uStack_f0 = 0;
    rect_03.y = fStack_74;
    rect_03.x = local_78;
    rect_03.w = (float)local_c8._0_4_;
    rect_03.h = (float)local_c8._4_4_;
    local_c8 = auVar7;
    nk_fill_rect_multi_color
              (b,rect_03,(nk_color)0xffffffff,(nk_color)0xffffffff,(nk_color)0xff000000,
               (nk_color)0xff000000);
    nk_stroke_line(b,local_b8 + -1.0,(float)local_f8,(float)local_a8._0_4_ + local_b8 + 2.0,
                   (float)local_f8,1.0,(nk_color)0xffffffff);
  }
  top = nk_hsv_f(local_e8,1.0,1.0);
  rect_04.w = (float)(undefined4)local_98;
  rect_04.h = (float)local_98._4_4_;
  rect_04.x = fVar23;
  rect_04.y = fVar24;
  nk_fill_rect_multi_color(b,rect_04,(nk_color)0xffffffff,top,top,(nk_color)0xffffffff);
  rect_05.w = (float)(undefined4)local_98;
  rect_05.h = (float)local_98._4_4_;
  nk_fill_rect_multi_color
            (b,rect_05,(nk_color)0x0,(nk_color)0x0,(nk_color)0xff000000,(nk_color)0xff000000);
  fVar16 = (float)(int)((float)local_68._0_4_ * local_104 + fVar23);
  local_f8 = CONCAT44((float)(int)(float)local_68._4_4_,fVar16);
  uStack_f0 = CONCAT44((float)(int)fStack_5c,(float)(int)fStack_60);
  fVar19 = (float)(int)((1.0 - local_100) * fVar22 + (float)local_d8);
  nk_stroke_line(b,fVar16 + -7.0,fVar19,fVar16 + -2.0,fVar19,1.0,(nk_color)0xffffffff);
  nk_stroke_line(b,(float)local_f8 + 7.0 + 1.0,fVar19,(float)local_f8 + 3.0,fVar19,1.0,
                 (nk_color)0xffffffff);
  nk_stroke_line(b,(float)local_f8,fVar19 + 7.0 + 1.0,(float)local_f8,fVar19 + 3.0,1.0,
                 (nk_color)0xffffffff);
  nk_stroke_line(b,(float)local_f8,fVar19 + -7.0,(float)local_f8,fVar19 + -2.0,1.0,
                 (nk_color)0xffffffff);
  return iVar10;
}

Assistant:

NK_API int
nk_color_pick(struct nk_context * ctx, struct nk_colorf *color,
    enum nk_color_format fmt)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_style *config;
    const struct nk_input *in;

    enum nk_widget_layout_states state;
    struct nk_rect bounds;

    NK_ASSERT(ctx);
    NK_ASSERT(color);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !color)
        return 0;

    win = ctx->current;
    config = &ctx->style;
    layout = win->layout;
    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_color_picker(&ctx->last_widget_state, &win->buffer, color, fmt, bounds,
                nk_vec2(0,0), in, config->font);
}